

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt19937_64.hpp
# Opt level: O3

ret_t trng::utility::u01xx_traits<double,_1UL,_trng::mt19937_64>::addin(mt19937_64 *r)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  
  iVar1 = (r->S).mti;
  if ((long)iVar1 < 0x138) {
    uVar4 = (r->S).mt[iVar1];
    iVar1 = iVar1 + 1;
  }
  else {
    uVar4 = (r->S).mt[0];
    lVar2 = -0x9c;
    do {
      uVar3 = uVar4 & 0xffffffff80000000;
      uVar4 = (r->S).mt[lVar2 + 0x9d];
      (r->S).mt[lVar2 + 0x9c] =
           *(ulong *)(&DAT_0011c230 + (ulong)((uint)uVar4 & 1) * 8) ^ r[1].S.mt[lVar2 + -2] ^
           ((uint)uVar4 & 0x7ffffffe | uVar3) >> 1;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0);
    uVar4 = (r->S).mt[0x9c];
    lVar2 = 0;
    do {
      uVar3 = uVar4 & 0xffffffff80000000;
      uVar4 = (r->S).mt[lVar2 + 0x9d];
      (r->S).mt[lVar2 + 0x9c] =
           *(ulong *)(&DAT_0011c230 + (ulong)((uint)uVar4 & 1) * 8) ^ (r->S).mt[lVar2] ^
           ((uint)uVar4 & 0x7ffffffe | uVar3) >> 1;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x9b);
    uVar4 = (r->S).mt[0];
    (r->S).mt[0x137] =
         *(ulong *)(&DAT_0011c230 + (ulong)((uint)uVar4 & 1) * 8) ^ (r->S).mt[0x9b] ^
         ((ulong)((uint)uVar4 & 0x7ffffffe) | (r->S).mt[0x137] & 0xffffffff80000000) >> 1;
    iVar1 = 1;
  }
  (r->S).mti = iVar1;
  uVar4 = uVar4 >> 0x1d & 0x555555555 ^ uVar4;
  uVar4 = (uVar4 & 0x38eb3ffff6d3) << 0x11 ^ uVar4;
  uVar4 = (ulong)((uint)uVar4 & 0x7ffbf77) << 0x25 ^ uVar4;
  return (double)(uVar4 >> 1 ^ uVar4 >> 0x2c);
}

Assistant:

inline mt19937_64::result_type mt19937_64::operator()() {
    const result_type mag01[2]{0u, 0xB5026F5AA96619E9u};
    if (S.mti >= mt19937_64::N) {  // generate N words at one time
      int i{0};
      for (; i < mt19937_64::N - mt19937_64::M; ++i) {
        const result_type x{(S.mt[i] & mt19937_64::UM) | (S.mt[i + 1] & mt19937_64::LM)};
        S.mt[i] = S.mt[i + mt19937_64::M] ^ (x >> 1u) ^ mag01[static_cast<int>(x & 1u)];
      }
      for (; i < mt19937_64::N - 1; ++i) {
        const result_type x{(S.mt[i] & mt19937_64::UM) | (S.mt[i + 1] & mt19937_64::LM)};
        S.mt[i] = S.mt[i + (mt19937_64::M - mt19937_64::N)] ^ (x >> 1u) ^
                  mag01[static_cast<int>(x & 1u)];
      }
      const result_type x{(S.mt[mt19937_64::N - 1] & UM) | (S.mt[0] & LM)};
      S.mt[N - 1] = S.mt[mt19937_64::M - 1] ^ (x >> 1u) ^ mag01[static_cast<int>(x & 1u)];
      S.mti = 0;
    }
    result_type x{S.mt[S.mti++]};
    x ^= (x >> 29u) & 0x5555555555555555u;
    x ^= (x << 17u) & 0x71D67FFFEDA60000u;
    x ^= (x << 37u) & 0xFFF7EEE000000000u;
    x ^= (x >> 43u);
    return x;
  }